

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

uint32 __thiscall crnd::symbol_codec::decode(symbol_codec *this,static_huffman_data_model *model)

{
  byte bVar1;
  int iVar2;
  decoder_tables *pdVar3;
  byte *pbVar4;
  uint32 *puVar5;
  char cVar6;
  byte *pbVar7;
  uint uVar8;
  int iVar9;
  uint32 uVar10;
  uint uVar11;
  
  pdVar3 = model->m_pDecode_tables;
  iVar2 = this->m_bit_count;
  if (iVar2 < 0x18) {
    pbVar7 = this->m_pDecode_buf_next;
    pbVar4 = this->m_pDecode_buf_end;
    uVar11 = 0;
    if (iVar2 < 0x10) {
      if (pbVar7 < pbVar4) {
        bVar1 = *pbVar7;
        pbVar7 = pbVar7 + 1;
        uVar8 = (uint)bVar1 << 8;
      }
      else {
        uVar8 = 0;
      }
      if (pbVar7 < pbVar4) {
        uVar11 = (uint)*pbVar7;
        pbVar7 = pbVar7 + 1;
      }
      uVar11 = uVar11 | uVar8;
      this->m_pDecode_buf_next = pbVar7;
      this->m_bit_count = iVar2 + 0x10;
      cVar6 = '\x10';
    }
    else {
      if (pbVar7 < pbVar4) {
        this->m_pDecode_buf_next = pbVar7 + 1;
        uVar11 = (uint)*pbVar7;
      }
      this->m_bit_count = iVar2 + 8;
      cVar6 = '\x18';
    }
    this->m_bit_buf = this->m_bit_buf | uVar11 << (cVar6 - (char)iVar2 & 0x1fU);
  }
  uVar11 = this->m_bit_buf;
  if (uVar11 >> 0x10 < pdVar3->m_table_max_code) {
    uVar10 = pdVar3->m_lookup[uVar11 >> (-(char)pdVar3->m_table_bits & 0x1fU)] & 0xffff;
    uVar8 = pdVar3->m_lookup[uVar11 >> (-(char)pdVar3->m_table_bits & 0x1fU)] >> 0x10;
  }
  else {
    iVar2 = pdVar3->m_decode_start_code_size - 0x21;
    do {
      iVar9 = iVar2;
      iVar2 = iVar9 + 1;
    } while (pdVar3->m_max_codes[iVar9 + 0x20U] <= uVar11 >> 0x10);
    uVar8 = (uVar11 >> (-(char)(iVar9 + 1) & 0x1fU)) + pdVar3->m_val_ptrs[iVar9 + 0x20U];
    puVar5 = &model->m_total_syms;
    if (uVar8 < *puVar5) {
      model = (static_huffman_data_model *)(ulong)pdVar3->m_sorted_symbol_order[(int)uVar8];
    }
    uVar10 = (uint32)model;
    if (*puVar5 <= uVar8) {
      return 0;
    }
    uVar8 = iVar9 + 0x21;
  }
  this->m_bit_buf = uVar11 << ((byte)uVar8 & 0x1f);
  this->m_bit_count = this->m_bit_count - uVar8;
  return uVar10;
}

Assistant:

uint32 symbol_codec::decode(const static_huffman_data_model& model)
    {
        const prefix_coding::decoder_tables* pTables = model.m_pDecode_tables;

        if (m_bit_count < 24)
        {
            if (m_bit_count < 16)
            {
                uint32 c0 = 0, c1 = 0;
                const uint8* p = m_pDecode_buf_next;
                if (p < m_pDecode_buf_end)
                    c0 = *p++;
                if (p < m_pDecode_buf_end)
                    c1 = *p++;
                m_pDecode_buf_next = p;
                m_bit_count += 16;
                uint32 c = (c0 << 8) | c1;
                m_bit_buf |= (c << (32 - m_bit_count));
            }
            else
            {
                uint32 c = (m_pDecode_buf_next < m_pDecode_buf_end) ? *m_pDecode_buf_next++ : 0;
                m_bit_count += 8;
                m_bit_buf |= (c << (32 - m_bit_count));
            }
        }

        uint32 k = (m_bit_buf >> 16) + 1;
        uint32 sym, len;

        if (k <= pTables->m_table_max_code)
        {
            uint32 t = pTables->m_lookup[m_bit_buf >> (32 - pTables->m_table_bits)];

            CRND_ASSERT(t != cUINT32_MAX);
            sym = t & cUINT16_MAX;
            len = t >> 16;

            CRND_ASSERT(model.m_code_sizes[sym] == len);
        }
        else
        {
            len = pTables->m_decode_start_code_size;

            for (;;)
            {
                if (k <= pTables->m_max_codes[len - 1])
                    break;
                len++;
            }

            int val_ptr = pTables->m_val_ptrs[len - 1] + (m_bit_buf >> (32 - len));

            if (((uint32)val_ptr >= model.m_total_syms))
            {
                // corrupted stream, or a bug
                CRND_ASSERT(0);
                return 0;
            }

            sym = pTables->m_sorted_symbol_order[val_ptr];
        }

        m_bit_buf <<= len;
        m_bit_count -= len;

        return sym;
    }